

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  WASTScript *pWVar2;
  ostream *poVar3;
  WASTScript *script_00;
  string_view buffer;
  Options local_2f8 [8];
  Options options;
  undefined1 local_248 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skipped;
  long local_208 [4];
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
  local_1e8;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_1b8;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_188;
  undefined1 local_140 [8];
  Result<wasm::Ok> result;
  Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
  script;
  char local_f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f0;
  bool local_d0;
  undefined1 local_c8 [8];
  Lexer lexer;
  string infile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&skipped;
  skipped._M_t._M_impl._0_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  lexer.buffer._M_str = (char *)&infile._M_string_length;
  ppcVar1 = &lexer.buffer._M_str;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)ppcVar1,"-","");
  skipped._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,"wasm-shell","");
  local_c8 = (undefined1  [8])&lexer.annotations;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Execute .wast files","");
  wasm::Options::Options
            (local_2f8,(string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)local_c8);
  if (local_c8 != (undefined1  [8])&lexer.annotations) {
    operator_delete((void *)local_c8,
                    (ulong)((long)&((lexer.annotations.
                                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->kind).super_IString
                                   .str._M_len + 1));
  }
  if ((long *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count != local_208) {
    operator_delete((void *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_208[0] + 1);
  }
  skipped._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,"INFILE","");
  lexer.pos = 0;
  lexer.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp:519:5)>
                ::_M_invoke;
  lexer.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp:519:5)>
                ::_M_manager;
  local_c8 = (undefined1  [8])ppcVar1;
  wasm::Options::add_positional((string *)local_2f8,(int)&skipped + 0x28,(function *)0x1);
  if (lexer.annotations.
      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)lexer.annotations.
              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
              ._M_impl.super__Vector_impl_data._M_start)(local_c8,local_c8,3);
  }
  if ((long *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count != local_208) {
    operator_delete((void *)skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    local_208[0] + 1);
  }
  wasm::Options::parse((int)local_2f8,(char **)(ulong)(uint)argc);
  wasm::read_file<std::__cxx11::string>
            ((string *)(infile.field_2._M_local_buf + 8),(int)&lexer + 0x50);
  pWVar2 = (WASTScript *)
           ((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  wasm::WATParser::parseScript(pWVar2,input._M_dataplus._M_p,infile.field_2._8_8_);
  if (local_f8 == '\x01') {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,
                        (char *)result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,_script);
    std::operator<<(poVar3,'\n');
  }
  else {
    local_d0 = false;
    buffer._M_str = (char *)infile.field_2._8_8_;
    buffer._M_len = (size_t)input._M_dataplus._M_p;
    wasm::WATParser::Lexer::Lexer
              ((Lexer *)local_c8,buffer,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_f0);
    if (local_d0 == true) {
      local_d0 = false;
      if (local_f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f0._M_value + 0x10)) {
        operator_delete((void *)local_f0._M_value._M_dataplus._M_p,local_f0._16_8_ + 1);
      }
    }
    Shell::Shell((Shell *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,local_2f8);
    script_00 = (WASTScript *)0x0;
    if (local_f8 == '\0') {
      script_00 = pWVar2;
    }
    Shell::run((Result<wasm::Ok> *)local_140,
               (Shell *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count,script_00);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
    ::~_Rb_tree(&local_188);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
    ::~_Rb_tree(&local_1b8);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ShellExternalInterface>_>_>_>
    ::~_Rb_tree(&local_1e8);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::Module>_>_>_>
                 *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
      Colors::outputColorCode((ostream *)&std::cerr,"\x1b[32m");
      Colors::outputColorCode((ostream *)&std::cerr,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"all checks passed.\n",0x13);
      Colors::outputColorCode((ostream *)&std::cerr,"\x1b[0m");
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_140);
      if (lexer.file.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\x01') {
        lexer.file.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._24_1_ = 0;
        if (lexer.annotations.
            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage !=
            (pointer)((long)&lexer.file.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 8U)) {
          operator_delete(lexer.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          lexer.file.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_string_length + 1);
        }
      }
      if (lexer.pos != 0) {
        operator_delete((void *)lexer.pos,
                        (long)lexer.annotations.
                              super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lexer.pos);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>,_wasm::Err>
                           *)((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if ((size_type *)infile.field_2._8_8_ != &input._M_string_length) {
        operator_delete((void *)infile.field_2._8_8_,input._M_string_length + 1);
      }
      wasm::Options::~Options(local_2f8);
      if ((size_type *)lexer.buffer._M_str != &infile._M_string_length) {
        operator_delete(lexer.buffer._M_str,infile._M_string_length + 1);
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_248);
      return 0;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_140,
                        result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
    std::operator<<(poVar3,'\n');
  }
  exit(1);
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::set<size_t> skipped;

  // Read stdin by default.
  std::string infile = "-";
  Options options("wasm-shell", "Execute .wast files");
  options.add_positional(
    "INFILE",
    Options::Arguments::One,
    [&](Options* o, const std::string& argument) { infile = argument; });
  options.parse(argc, argv);

  auto input = read_file<std::string>(infile, Flags::Text);

  // Check that we can parse the script correctly with the new parser.
  auto script = WATParser::parseScript(input);
  if (auto* err = script.getErr()) {
    std::cerr << err->msg << '\n';
    exit(1);
  }

  Lexer lexer(input);
  auto result = Shell(options).run(*script);
  if (auto* err = result.getErr()) {
    std::cerr << err->msg << '\n';
    exit(1);
  }

  Colors::green(std::cerr);
  Colors::bold(std::cerr);
  std::cerr << "all checks passed.\n";
  Colors::normal(std::cerr);
}